

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceMatrixDecomposition.cpp
# Opt level: O0

void __thiscall OpenMD::ForceMatrixDecomposition::collectData(ForceMatrixDecomposition *this)

{
  double dVar1;
  ulong uVar2;
  int iVar3;
  Snapshot *pSVar4;
  size_type sVar5;
  reference pvVar6;
  reference pvVar7;
  double *pdVar8;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *this_00;
  MPI_Comm poVar9;
  long in_RDI;
  MPI_Comm col;
  int i_15;
  int i_14;
  vector<double,_std::allocator<double>_> ppot_temp;
  int npp;
  int i_13;
  int ii_7;
  size_t ii_6;
  size_t ii_5;
  size_t ii_4;
  int i_12;
  int ii_3;
  size_t ii_2;
  size_t ii_1;
  size_t ii;
  vector<OpenMD::Vector<double,_7U>,_std::allocator<OpenMD::Vector<double,_7U>_>_> selepot_temp;
  vector<OpenMD::Vector<double,_7U>,_std::allocator<OpenMD::Vector<double,_7U>_>_> expot_temp;
  vector<OpenMD::Vector<double,_7U>,_std::allocator<OpenMD::Vector<double,_7U>_>_> pot_temp;
  int i_11;
  int i_10;
  vector<double,_std::allocator<double>_> sp_tmp;
  int nsp;
  int i_9;
  int i_8;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> efield_tmp;
  int nef;
  int i_7;
  int i_6;
  vector<double,_std::allocator<double>_> fqfrc_tmp;
  int nq;
  int i_5;
  int i_4;
  vector<double,_std::allocator<double>_> skch_tmp;
  int ns;
  int i_3;
  int i_2;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> trq_tmp;
  int nt;
  int i_1;
  int i;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> frc_tmp;
  int n;
  Vector<double,_7U> *in_stack_fffffffffffffa18;
  Vector<double,_7U> *in_stack_fffffffffffffa20;
  __normal_iterator<OpenMD::Vector<double,_7U>_*,_std::vector<OpenMD::Vector<double,_7U>,_std::allocator<OpenMD::Vector<double,_7U>_>_>_>
  in_stack_fffffffffffffa28;
  __normal_iterator<OpenMD::Vector<double,_7U>_*,_std::vector<OpenMD::Vector<double,_7U>,_std::allocator<OpenMD::Vector<double,_7U>_>_>_>
  in_stack_fffffffffffffa30;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
  *in_stack_fffffffffffffa38;
  Plan<double> *in_stack_fffffffffffffa40;
  value_type vVar10;
  int local_424;
  int local_408;
  vector<double,_std::allocator<double>_> local_3f8;
  int local_3dc;
  int local_3d8;
  uint local_3d4;
  ulong local_3d0;
  ulong local_3c8;
  ulong local_3c0;
  double local_3b8;
  Vector<double,_7U> local_3b0;
  Vector<double,_7U> *local_378;
  Vector<double,_7U> *local_370;
  double local_368;
  Vector<double,_7U> local_360;
  Vector<double,_7U> *local_328;
  Vector<double,_7U> *local_320;
  double local_318;
  Vector<double,_7U> local_310;
  Vector<double,_7U> *local_2d8;
  Vector<double,_7U> *local_2d0;
  int local_2c8;
  uint local_2c4;
  ulong local_2c0;
  ulong local_2b8;
  ulong local_2b0;
  double local_2a0;
  Vector<double,_7U> local_298;
  vector<OpenMD::Vector<double,_7U>,_std::allocator<OpenMD::Vector<double,_7U>_>_> local_260;
  double local_240;
  Vector<double,_7U> local_238;
  vector<OpenMD::Vector<double,_7U>,_std::allocator<OpenMD::Vector<double,_7U>_>_> local_200;
  double local_1e0;
  Vector<double,_7U> local_1d8;
  vector<OpenMD::Vector<double,_7U>,_std::allocator<OpenMD::Vector<double,_7U>_>_> local_1a0;
  int local_184;
  int local_180;
  undefined8 local_178;
  vector<double,_std::allocator<double>_> local_170;
  int local_158;
  int local_154;
  double local_150;
  Vector<double,_3U> local_148;
  int local_130;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> local_128;
  int local_110;
  int local_10c;
  int local_108;
  undefined8 local_100;
  vector<double,_std::allocator<double>_> local_f8;
  int local_e0;
  int local_dc;
  int local_d8;
  undefined8 local_d0;
  vector<double,_std::allocator<double>_> local_c8;
  int local_b0;
  int local_ac;
  double local_a8;
  Vector<double,_3U> local_a0;
  int local_88;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> local_80;
  int local_68;
  int local_64;
  double local_60;
  Vector<double,_3U> local_58;
  int local_40;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> local_28;
  int local_c;
  
  pSVar4 = SnapshotManager::getCurrentSnapshot(*(SnapshotManager **)(in_RDI + 0x10));
  *(Snapshot **)(in_RDI + 0x18) = pSVar4;
  iVar3 = SnapshotManager::getAtomStorageLayout(*(SnapshotManager **)(in_RDI + 0x10));
  *(int *)(in_RDI + 0x30) = iVar3;
  sVar5 = std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::size
                    ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
                     (*(long *)(in_RDI + 0x18) + 0x30));
  local_c = (int)sVar5;
  std::allocator<OpenMD::Vector3<double>_>::allocator
            ((allocator<OpenMD::Vector3<double>_> *)0x1a3206);
  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::vector
            ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
             in_stack_fffffffffffffa40,(size_type)in_stack_fffffffffffffa38,
             (value_type *)in_stack_fffffffffffffa30._M_current,
             (allocator_type *)in_stack_fffffffffffffa28._M_current);
  std::allocator<OpenMD::Vector3<double>_>::~allocator
            ((allocator<OpenMD::Vector3<double>_> *)0x1a3239);
  Plan<OpenMD::Vector3<double>_>::scatter
            ((Plan<OpenMD::Vector3<double>_> *)in_stack_fffffffffffffa40,in_stack_fffffffffffffa38,
             (vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
             in_stack_fffffffffffffa30._M_current);
  for (local_40 = 0; local_40 < local_c; local_40 = local_40 + 1) {
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator[]
              (&local_28,(long)local_40);
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator[]
              ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
               (*(long *)(in_RDI + 0x18) + 0x30),(long)local_40);
    Vector<double,_3U>::operator+=
              ((Vector<double,_3U> *)in_stack_fffffffffffffa20,
               (Vector<double,_3U> *)in_stack_fffffffffffffa18);
    local_60 = 0.0;
    Vector<double,_3U>::Vector(&local_58,&local_60);
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator[]
              (&local_28,(long)local_40);
    Vector3<double>::operator=
              ((Vector3<double> *)in_stack_fffffffffffffa28._M_current,
               (Vector<double,_3U> *)in_stack_fffffffffffffa20);
  }
  Plan<OpenMD::Vector3<double>_>::scatter
            ((Plan<OpenMD::Vector3<double>_> *)in_stack_fffffffffffffa40,in_stack_fffffffffffffa38,
             (vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
             in_stack_fffffffffffffa30._M_current);
  for (local_64 = 0; local_64 < local_c; local_64 = local_64 + 1) {
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator[]
              (&local_28,(long)local_64);
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator[]
              ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
               (*(long *)(in_RDI + 0x18) + 0x30),(long)local_64);
    Vector<double,_3U>::operator+=
              ((Vector<double,_3U> *)in_stack_fffffffffffffa20,
               (Vector<double,_3U> *)in_stack_fffffffffffffa18);
  }
  if ((*(uint *)(in_RDI + 0x30) & 0x20) != 0) {
    sVar5 = std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::size
                      ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *
                       )(*(long *)(in_RDI + 0x18) + 0x78));
    local_68 = (int)sVar5;
    std::allocator<OpenMD::Vector3<double>_>::allocator
              ((allocator<OpenMD::Vector3<double>_> *)0x1a3469);
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::vector
              ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
               in_stack_fffffffffffffa40,(size_type)in_stack_fffffffffffffa38,
               (value_type *)in_stack_fffffffffffffa30._M_current,
               (allocator_type *)in_stack_fffffffffffffa28._M_current);
    std::allocator<OpenMD::Vector3<double>_>::~allocator
              ((allocator<OpenMD::Vector3<double>_> *)0x1a349c);
    Plan<OpenMD::Vector3<double>_>::scatter
              ((Plan<OpenMD::Vector3<double>_> *)in_stack_fffffffffffffa40,in_stack_fffffffffffffa38
               ,(vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
                in_stack_fffffffffffffa30._M_current);
    for (local_88 = 0; local_88 < local_68; local_88 = local_88 + 1) {
      std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator[]
                (&local_80,(long)local_88);
      std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator[]
                ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
                 (*(long *)(in_RDI + 0x18) + 0x78),(long)local_88);
      Vector<double,_3U>::operator+=
                ((Vector<double,_3U> *)in_stack_fffffffffffffa20,
                 (Vector<double,_3U> *)in_stack_fffffffffffffa18);
      local_a8 = 0.0;
      Vector<double,_3U>::Vector(&local_a0,&local_a8);
      std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator[]
                (&local_80,(long)local_88);
      Vector3<double>::operator=
                ((Vector3<double> *)in_stack_fffffffffffffa28._M_current,
                 (Vector<double,_3U> *)in_stack_fffffffffffffa20);
    }
    Plan<OpenMD::Vector3<double>_>::scatter
              ((Plan<OpenMD::Vector3<double>_> *)in_stack_fffffffffffffa40,in_stack_fffffffffffffa38
               ,(vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
                in_stack_fffffffffffffa30._M_current);
    for (local_ac = 0; local_ac < local_68; local_ac = local_ac + 1) {
      std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator[]
                (&local_80,(long)local_ac);
      std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator[]
                ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
                 (*(long *)(in_RDI + 0x18) + 0x78),(long)local_ac);
      Vector<double,_3U>::operator+=
                ((Vector<double,_3U> *)in_stack_fffffffffffffa20,
                 (Vector<double,_3U> *)in_stack_fffffffffffffa18);
    }
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::~vector
              ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
               in_stack_fffffffffffffa30._M_current);
  }
  if ((*(uint *)(in_RDI + 0x30) & 0x2000) != 0) {
    sVar5 = std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)(*(long *)(in_RDI + 0x18) + 0x138)
                      );
    local_b0 = (int)sVar5;
    local_d0 = 0;
    std::allocator<double>::allocator((allocator<double> *)0x1a36f7);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffa40,
               (size_type)in_stack_fffffffffffffa38,(in_stack_fffffffffffffa30._M_current)->data_,
               (allocator_type *)in_stack_fffffffffffffa28._M_current);
    std::allocator<double>::~allocator((allocator<double> *)0x1a372b);
    Plan<double>::scatter
              (in_stack_fffffffffffffa40,
               (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffa38,
               (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffa30._M_current);
    for (local_d8 = 0; local_d8 < local_b0; local_d8 = local_d8 + 1) {
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](&local_c8,(long)local_d8);
      dVar1 = *pvVar6;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)
                          (*(long *)(in_RDI + 0x18) + 0x138),(long)local_d8);
      *pvVar6 = dVar1 + *pvVar6;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](&local_c8,(long)local_d8);
      *pvVar6 = 0.0;
    }
    Plan<double>::scatter
              (in_stack_fffffffffffffa40,
               (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffa38,
               (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffa30._M_current);
    for (local_dc = 0; local_dc < local_b0; local_dc = local_dc + 1) {
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](&local_c8,(long)local_dc);
      dVar1 = *pvVar6;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)
                          (*(long *)(in_RDI + 0x18) + 0x138),(long)local_dc);
      *pvVar6 = dVar1 + *pvVar6;
    }
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffa30._M_current);
  }
  if ((*(uint *)(in_RDI + 0x30) & 0x10000) != 0) {
    sVar5 = std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)(*(long *)(in_RDI + 0x18) + 0x180)
                      );
    local_e0 = (int)sVar5;
    local_100 = 0;
    std::allocator<double>::allocator((allocator<double> *)0x1a3962);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffa40,
               (size_type)in_stack_fffffffffffffa38,(in_stack_fffffffffffffa30._M_current)->data_,
               (allocator_type *)in_stack_fffffffffffffa28._M_current);
    std::allocator<double>::~allocator((allocator<double> *)0x1a3996);
    Plan<double>::scatter
              (in_stack_fffffffffffffa40,
               (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffa38,
               (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffa30._M_current);
    for (local_108 = 0; local_108 < local_e0; local_108 = local_108 + 1) {
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](&local_f8,(long)local_108);
      dVar1 = *pvVar6;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)
                          (*(long *)(in_RDI + 0x18) + 0x180),(long)local_108);
      *pvVar6 = dVar1 + *pvVar6;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](&local_f8,(long)local_108);
      *pvVar6 = 0.0;
    }
    Plan<double>::scatter
              (in_stack_fffffffffffffa40,
               (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffa38,
               (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffa30._M_current);
    for (local_10c = 0; local_10c < local_e0; local_10c = local_10c + 1) {
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](&local_f8,(long)local_10c);
      dVar1 = *pvVar6;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)
                          (*(long *)(in_RDI + 0x18) + 0x180),(long)local_10c);
      *pvVar6 = dVar1 + *pvVar6;
    }
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffa30._M_current);
  }
  if ((*(uint *)(in_RDI + 0x30) & 0x1000) != 0) {
    sVar5 = std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::size
                      ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *
                       )(*(long *)(in_RDI + 0x18) + 0x120));
    local_110 = (int)sVar5;
    std::allocator<OpenMD::Vector3<double>_>::allocator
              ((allocator<OpenMD::Vector3<double>_> *)0x1a3bc1);
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::vector
              ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
               in_stack_fffffffffffffa40,(size_type)in_stack_fffffffffffffa38,
               (value_type *)in_stack_fffffffffffffa30._M_current,
               (allocator_type *)in_stack_fffffffffffffa28._M_current);
    std::allocator<OpenMD::Vector3<double>_>::~allocator
              ((allocator<OpenMD::Vector3<double>_> *)0x1a3bf4);
    Plan<OpenMD::Vector3<double>_>::scatter
              ((Plan<OpenMD::Vector3<double>_> *)in_stack_fffffffffffffa40,in_stack_fffffffffffffa38
               ,(vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
                in_stack_fffffffffffffa30._M_current);
    for (local_130 = 0; local_130 < local_110; local_130 = local_130 + 1) {
      std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator[]
                (&local_128,(long)local_130);
      std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator[]
                ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
                 (*(long *)(in_RDI + 0x18) + 0x120),(long)local_130);
      Vector<double,_3U>::operator+=
                ((Vector<double,_3U> *)in_stack_fffffffffffffa20,
                 (Vector<double,_3U> *)in_stack_fffffffffffffa18);
      local_150 = 0.0;
      Vector<double,_3U>::Vector(&local_148,&local_150);
      std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator[]
                (&local_128,(long)local_130);
      Vector3<double>::operator=
                ((Vector3<double> *)in_stack_fffffffffffffa28._M_current,
                 (Vector<double,_3U> *)in_stack_fffffffffffffa20);
    }
    Plan<OpenMD::Vector3<double>_>::scatter
              ((Plan<OpenMD::Vector3<double>_> *)in_stack_fffffffffffffa40,in_stack_fffffffffffffa38
               ,(vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
                in_stack_fffffffffffffa30._M_current);
    for (local_154 = 0; local_154 < local_110; local_154 = local_154 + 1) {
      std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator[]
                (&local_128,(long)local_154);
      std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator[]
                ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
                 (*(long *)(in_RDI + 0x18) + 0x120),(long)local_154);
      Vector<double,_3U>::operator+=
                ((Vector<double,_3U> *)in_stack_fffffffffffffa20,
                 (Vector<double,_3U> *)in_stack_fffffffffffffa18);
    }
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::~vector
              ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
               in_stack_fffffffffffffa30._M_current);
  }
  if ((*(uint *)(in_RDI + 0x30) & 0x20000) != 0) {
    sVar5 = std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)(*(long *)(in_RDI + 0x18) + 0x198)
                      );
    local_158 = (int)sVar5;
    local_178 = 0;
    std::allocator<double>::allocator((allocator<double> *)0x1a3e55);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffa40,
               (size_type)in_stack_fffffffffffffa38,(in_stack_fffffffffffffa30._M_current)->data_,
               (allocator_type *)in_stack_fffffffffffffa28._M_current);
    std::allocator<double>::~allocator((allocator<double> *)0x1a3e89);
    Plan<double>::scatter
              (in_stack_fffffffffffffa40,
               (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffa38,
               (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffa30._M_current);
    for (local_180 = 0; local_180 < local_158; local_180 = local_180 + 1) {
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](&local_170,(long)local_180);
      dVar1 = *pvVar6;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)
                          (*(long *)(in_RDI + 0x18) + 0x198),(long)local_180);
      *pvVar6 = dVar1 + *pvVar6;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](&local_170,(long)local_180);
      *pvVar6 = 0.0;
    }
    Plan<double>::scatter
              (in_stack_fffffffffffffa40,
               (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffa38,
               (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffa30._M_current);
    for (local_184 = 0; local_184 < local_158; local_184 = local_184 + 1) {
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](&local_170,(long)local_184);
      dVar1 = *pvVar6;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)
                          (*(long *)(in_RDI + 0x18) + 0x198),(long)local_184);
      *pvVar6 = dVar1 + *pvVar6;
    }
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffa30._M_current);
  }
  iVar3 = Snapshot::getNumberOfAtoms((Snapshot *)0x1a4068);
  *(int *)(in_RDI + 0x2b0) = iVar3;
  local_1e0 = 0.0;
  Vector<double,_7U>::Vector(&local_1d8,&local_1e0);
  std::allocator<OpenMD::Vector<double,_7U>_>::allocator
            ((allocator<OpenMD::Vector<double,_7U>_> *)0x1a40cd);
  std::vector<OpenMD::Vector<double,_7U>,_std::allocator<OpenMD::Vector<double,_7U>_>_>::vector
            ((vector<OpenMD::Vector<double,_7U>,_std::allocator<OpenMD::Vector<double,_7U>_>_> *)
             in_stack_fffffffffffffa40,(size_type)in_stack_fffffffffffffa38,
             in_stack_fffffffffffffa30._M_current,
             (allocator_type *)in_stack_fffffffffffffa28._M_current);
  std::allocator<OpenMD::Vector<double,_7U>_>::~allocator
            ((allocator<OpenMD::Vector<double,_7U>_> *)0x1a4101);
  local_240 = 0.0;
  Vector<double,_7U>::Vector(&local_238,&local_240);
  std::allocator<OpenMD::Vector<double,_7U>_>::allocator
            ((allocator<OpenMD::Vector<double,_7U>_> *)0x1a4150);
  std::vector<OpenMD::Vector<double,_7U>,_std::allocator<OpenMD::Vector<double,_7U>_>_>::vector
            ((vector<OpenMD::Vector<double,_7U>,_std::allocator<OpenMD::Vector<double,_7U>_>_> *)
             in_stack_fffffffffffffa40,(size_type)in_stack_fffffffffffffa38,
             in_stack_fffffffffffffa30._M_current,
             (allocator_type *)in_stack_fffffffffffffa28._M_current);
  std::allocator<OpenMD::Vector<double,_7U>_>::~allocator
            ((allocator<OpenMD::Vector<double,_7U>_> *)0x1a4184);
  local_2a0 = 0.0;
  Vector<double,_7U>::Vector(&local_298,&local_2a0);
  std::allocator<OpenMD::Vector<double,_7U>_>::allocator
            ((allocator<OpenMD::Vector<double,_7U>_> *)0x1a41d3);
  std::vector<OpenMD::Vector<double,_7U>,_std::allocator<OpenMD::Vector<double,_7U>_>_>::vector
            ((vector<OpenMD::Vector<double,_7U>,_std::allocator<OpenMD::Vector<double,_7U>_>_> *)
             in_stack_fffffffffffffa40,(size_type)in_stack_fffffffffffffa38,
             in_stack_fffffffffffffa30._M_current,
             (allocator_type *)in_stack_fffffffffffffa28._M_current);
  std::allocator<OpenMD::Vector<double,_7U>_>::~allocator
            ((allocator<OpenMD::Vector<double,_7U>_> *)0x1a4207);
  Plan<OpenMD::Vector<double,_7U>_>::scatter
            ((Plan<OpenMD::Vector<double,_7U>_> *)in_stack_fffffffffffffa40,
             (vector<OpenMD::Vector<double,_7U>,_std::allocator<OpenMD::Vector<double,_7U>_>_> *)
             in_stack_fffffffffffffa38,
             (vector<OpenMD::Vector<double,_7U>,_std::allocator<OpenMD::Vector<double,_7U>_>_> *)
             in_stack_fffffffffffffa30._M_current);
  Plan<OpenMD::Vector<double,_7U>_>::scatter
            ((Plan<OpenMD::Vector<double,_7U>_> *)in_stack_fffffffffffffa40,
             (vector<OpenMD::Vector<double,_7U>,_std::allocator<OpenMD::Vector<double,_7U>_>_> *)
             in_stack_fffffffffffffa38,
             (vector<OpenMD::Vector<double,_7U>,_std::allocator<OpenMD::Vector<double,_7U>_>_> *)
             in_stack_fffffffffffffa30._M_current);
  Plan<OpenMD::Vector<double,_7U>_>::scatter
            ((Plan<OpenMD::Vector<double,_7U>_> *)in_stack_fffffffffffffa40,
             (vector<OpenMD::Vector<double,_7U>,_std::allocator<OpenMD::Vector<double,_7U>_>_> *)
             in_stack_fffffffffffffa38,
             (vector<OpenMD::Vector<double,_7U>,_std::allocator<OpenMD::Vector<double,_7U>_>_> *)
             in_stack_fffffffffffffa30._M_current);
  for (local_2b0 = 0; uVar2 = local_2b0,
      sVar5 = std::vector<OpenMD::Vector<double,_7U>,_std::allocator<OpenMD::Vector<double,_7U>_>_>
              ::size(&local_1a0), uVar2 < sVar5; local_2b0 = local_2b0 + 1) {
    std::vector<OpenMD::Vector<double,_7U>,_std::allocator<OpenMD::Vector<double,_7U>_>_>::
    operator[](&local_1a0,local_2b0);
    Vector<double,_7U>::operator+=(in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
  }
  for (local_2b8 = 0; uVar2 = local_2b8,
      sVar5 = std::vector<OpenMD::Vector<double,_7U>,_std::allocator<OpenMD::Vector<double,_7U>_>_>
              ::size(&local_200), uVar2 < sVar5; local_2b8 = local_2b8 + 1) {
    std::vector<OpenMD::Vector<double,_7U>,_std::allocator<OpenMD::Vector<double,_7U>_>_>::
    operator[](&local_200,local_2b8);
    Vector<double,_7U>::operator+=(in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
  }
  for (local_2c0 = 0; uVar2 = local_2c0,
      sVar5 = std::vector<OpenMD::Vector<double,_7U>,_std::allocator<OpenMD::Vector<double,_7U>_>_>
              ::size(&local_260), uVar2 < sVar5; local_2c0 = local_2c0 + 1) {
    std::vector<OpenMD::Vector<double,_7U>,_std::allocator<OpenMD::Vector<double,_7U>_>_>::
    operator[](&local_260,local_2c0);
    Vector<double,_7U>::operator+=(in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
  }
  if ((*(uint *)(in_RDI + 0x30) & 0x40) != 0) {
    for (local_2c4 = 0; (int)local_2c4 < 7; local_2c4 = local_2c4 + 1) {
      for (local_2c8 = 0; local_2c8 < *(int *)(in_RDI + 0x2b0); local_2c8 = local_2c8 + 1) {
        pvVar7 = std::
                 vector<OpenMD::Vector<double,_7U>,_std::allocator<OpenMD::Vector<double,_7U>_>_>::
                 operator[](&local_1a0,(long)local_2c8);
        pdVar8 = Vector<double,_7U>::operator()(pvVar7,local_2c4);
        dVar1 = *pdVar8;
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)
                            (*(long *)(in_RDI + 0x18) + 0x90),(long)local_2c8);
        *pvVar6 = dVar1 + dVar1 + *pvVar6;
      }
    }
  }
  local_2d0 = (Vector<double,_7U> *)
              std::vector<OpenMD::Vector<double,_7U>,_std::allocator<OpenMD::Vector<double,_7U>_>_>
              ::begin((vector<OpenMD::Vector<double,_7U>,_std::allocator<OpenMD::Vector<double,_7U>_>_>
                       *)in_stack_fffffffffffffa18);
  local_2d8 = (Vector<double,_7U> *)
              std::vector<OpenMD::Vector<double,_7U>,_std::allocator<OpenMD::Vector<double,_7U>_>_>
              ::end((vector<OpenMD::Vector<double,_7U>,_std::allocator<OpenMD::Vector<double,_7U>_>_>
                     *)in_stack_fffffffffffffa18);
  local_318 = 0.0;
  Vector<double,_7U>::Vector(&local_310,&local_318);
  std::
  fill<__gnu_cxx::__normal_iterator<OpenMD::Vector<double,7u>*,std::vector<OpenMD::Vector<double,7u>,std::allocator<OpenMD::Vector<double,7u>>>>,OpenMD::Vector<double,7u>>
            (in_stack_fffffffffffffa30,in_stack_fffffffffffffa28,in_stack_fffffffffffffa20);
  local_320 = (Vector<double,_7U> *)
              std::vector<OpenMD::Vector<double,_7U>,_std::allocator<OpenMD::Vector<double,_7U>_>_>
              ::begin((vector<OpenMD::Vector<double,_7U>,_std::allocator<OpenMD::Vector<double,_7U>_>_>
                       *)in_stack_fffffffffffffa18);
  local_328 = (Vector<double,_7U> *)
              std::vector<OpenMD::Vector<double,_7U>,_std::allocator<OpenMD::Vector<double,_7U>_>_>
              ::end((vector<OpenMD::Vector<double,_7U>,_std::allocator<OpenMD::Vector<double,_7U>_>_>
                     *)in_stack_fffffffffffffa18);
  local_368 = 0.0;
  Vector<double,_7U>::Vector(&local_360,&local_368);
  std::
  fill<__gnu_cxx::__normal_iterator<OpenMD::Vector<double,7u>*,std::vector<OpenMD::Vector<double,7u>,std::allocator<OpenMD::Vector<double,7u>>>>,OpenMD::Vector<double,7u>>
            (in_stack_fffffffffffffa30,in_stack_fffffffffffffa28,in_stack_fffffffffffffa20);
  local_370 = (Vector<double,_7U> *)
              std::vector<OpenMD::Vector<double,_7U>,_std::allocator<OpenMD::Vector<double,_7U>_>_>
              ::begin((vector<OpenMD::Vector<double,_7U>,_std::allocator<OpenMD::Vector<double,_7U>_>_>
                       *)in_stack_fffffffffffffa18);
  local_378 = (Vector<double,_7U> *)
              std::vector<OpenMD::Vector<double,_7U>,_std::allocator<OpenMD::Vector<double,_7U>_>_>
              ::end((vector<OpenMD::Vector<double,_7U>,_std::allocator<OpenMD::Vector<double,_7U>_>_>
                     *)in_stack_fffffffffffffa18);
  local_3b8 = 0.0;
  Vector<double,_7U>::Vector(&local_3b0,&local_3b8);
  std::
  fill<__gnu_cxx::__normal_iterator<OpenMD::Vector<double,7u>*,std::vector<OpenMD::Vector<double,7u>,std::allocator<OpenMD::Vector<double,7u>>>>,OpenMD::Vector<double,7u>>
            (in_stack_fffffffffffffa30,in_stack_fffffffffffffa28,in_stack_fffffffffffffa20);
  Plan<OpenMD::Vector<double,_7U>_>::scatter
            ((Plan<OpenMD::Vector<double,_7U>_> *)in_stack_fffffffffffffa40,
             (vector<OpenMD::Vector<double,_7U>,_std::allocator<OpenMD::Vector<double,_7U>_>_> *)
             in_stack_fffffffffffffa38,
             (vector<OpenMD::Vector<double,_7U>,_std::allocator<OpenMD::Vector<double,_7U>_>_> *)
             in_stack_fffffffffffffa30._M_current);
  Plan<OpenMD::Vector<double,_7U>_>::scatter
            ((Plan<OpenMD::Vector<double,_7U>_> *)in_stack_fffffffffffffa40,
             (vector<OpenMD::Vector<double,_7U>,_std::allocator<OpenMD::Vector<double,_7U>_>_> *)
             in_stack_fffffffffffffa38,
             (vector<OpenMD::Vector<double,_7U>,_std::allocator<OpenMD::Vector<double,_7U>_>_> *)
             in_stack_fffffffffffffa30._M_current);
  Plan<OpenMD::Vector<double,_7U>_>::scatter
            ((Plan<OpenMD::Vector<double,_7U>_> *)in_stack_fffffffffffffa40,
             (vector<OpenMD::Vector<double,_7U>,_std::allocator<OpenMD::Vector<double,_7U>_>_> *)
             in_stack_fffffffffffffa38,
             (vector<OpenMD::Vector<double,_7U>,_std::allocator<OpenMD::Vector<double,_7U>_>_> *)
             in_stack_fffffffffffffa30._M_current);
  for (local_3c0 = 0; uVar2 = local_3c0,
      sVar5 = std::vector<OpenMD::Vector<double,_7U>,_std::allocator<OpenMD::Vector<double,_7U>_>_>
              ::size(&local_1a0), uVar2 < sVar5; local_3c0 = local_3c0 + 1) {
    std::vector<OpenMD::Vector<double,_7U>,_std::allocator<OpenMD::Vector<double,_7U>_>_>::
    operator[](&local_1a0,local_3c0);
    Vector<double,_7U>::operator+=(in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
  }
  for (local_3c8 = 0; uVar2 = local_3c8,
      sVar5 = std::vector<OpenMD::Vector<double,_7U>,_std::allocator<OpenMD::Vector<double,_7U>_>_>
              ::size(&local_200), uVar2 < sVar5; local_3c8 = local_3c8 + 1) {
    std::vector<OpenMD::Vector<double,_7U>,_std::allocator<OpenMD::Vector<double,_7U>_>_>::
    operator[](&local_200,local_3c8);
    Vector<double,_7U>::operator+=(in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
  }
  for (local_3d0 = 0; uVar2 = local_3d0,
      sVar5 = std::vector<OpenMD::Vector<double,_7U>,_std::allocator<OpenMD::Vector<double,_7U>_>_>
              ::size(&local_260), uVar2 < sVar5; local_3d0 = local_3d0 + 1) {
    std::vector<OpenMD::Vector<double,_7U>,_std::allocator<OpenMD::Vector<double,_7U>_>_>::
    operator[](&local_260,local_3d0);
    Vector<double,_7U>::operator+=(in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
  }
  if ((*(uint *)(in_RDI + 0x30) & 0x40) != 0) {
    for (local_3d4 = 0; (int)local_3d4 < 7; local_3d4 = local_3d4 + 1) {
      for (local_3d8 = 0; local_3d8 < *(int *)(in_RDI + 0x2b0); local_3d8 = local_3d8 + 1) {
        pvVar7 = std::
                 vector<OpenMD::Vector<double,_7U>,_std::allocator<OpenMD::Vector<double,_7U>_>_>::
                 operator[](&local_1a0,(long)local_3d8);
        pdVar8 = Vector<double,_7U>::operator()(pvVar7,local_3d4);
        dVar1 = *pdVar8;
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)
                            (*(long *)(in_RDI + 0x18) + 0x90),(long)local_3d8);
        *pvVar6 = dVar1 + dVar1 + *pvVar6;
      }
    }
  }
  if ((*(uint *)(in_RDI + 0x30) & 0x40) != 0) {
    sVar5 = std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)(*(long *)(in_RDI + 0x18) + 0x90))
    ;
    local_3dc = (int)sVar5;
    std::allocator<double>::allocator((allocator<double> *)0x1a4a3d);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffa40,
               (size_type)in_stack_fffffffffffffa38,(in_stack_fffffffffffffa30._M_current)->data_,
               (allocator_type *)in_stack_fffffffffffffa28._M_current);
    std::allocator<double>::~allocator((allocator<double> *)0x1a4a6b);
    Plan<double>::scatter
              (in_stack_fffffffffffffa40,
               (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffa38,
               (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffa30._M_current);
    for (local_408 = 0; local_408 < local_3dc; local_408 = local_408 + 1) {
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](&local_3f8,(long)local_408);
      dVar1 = *pvVar6;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)
                          (*(long *)(in_RDI + 0x18) + 0x90),(long)local_408);
      *pvVar6 = dVar1 + *pvVar6;
    }
    std::vector<double,_std::allocator<double>_>::begin
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffa18);
    std::vector<double,_std::allocator<double>_>::end
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffa18);
    std::
    fill<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
              ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
               in_stack_fffffffffffffa30._M_current,
               (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
               in_stack_fffffffffffffa28._M_current,in_stack_fffffffffffffa20->data_);
    Plan<double>::scatter
              (in_stack_fffffffffffffa40,
               (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffa38,
               (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffa30._M_current);
    for (local_424 = 0; local_424 < local_3dc; local_424 = local_424 + 1) {
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](&local_3f8,(long)local_424);
      vVar10 = *pvVar6;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)
                          (*(long *)(in_RDI + 0x18) + 0x90),(long)local_424);
      *pvVar6 = vVar10 + *pvVar6;
    }
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffa30._M_current);
  }
  pdVar8 = Vector<double,_7U>::operator[]((Vector<double,_7U> *)(in_RDI + 0x90),0);
  MPI_Allreduce(1,pdVar8,7,&ompi_mpi_double,&ompi_mpi_op_sum,&ompi_mpi_comm_world);
  this_00 = (vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
            Vector<double,_7U>::operator[]((Vector<double,_7U> *)(in_RDI + 0x100),0);
  MPI_Allreduce(1,this_00,7,&ompi_mpi_double,&ompi_mpi_op_sum,&ompi_mpi_comm_world);
  pdVar8 = Vector<double,_7U>::operator[]((Vector<double,_7U> *)(in_RDI + 0x170),0);
  MPI_Allreduce(1,pdVar8,7,&ompi_mpi_double,&ompi_mpi_op_sum,&ompi_mpi_comm_world);
  poVar9 = Communicator<(OpenMD::communicatorType)2>::getComm
                     ((Communicator<(OpenMD::communicatorType)2> *)(in_RDI + 0xa38));
  pdVar8 = Vector<double,_3U>::operator[]
                     ((Vector<double,_3U> *)(*(long *)(in_RDI + 0x18) + 0xa28),0);
  MPI_Allreduce(1,pdVar8,3,&ompi_mpi_double,&ompi_mpi_op_sum,poVar9);
  std::vector<OpenMD::Vector<double,_7U>,_std::allocator<OpenMD::Vector<double,_7U>_>_>::~vector
            ((vector<OpenMD::Vector<double,_7U>,_std::allocator<OpenMD::Vector<double,_7U>_>_> *)
             this_00);
  std::vector<OpenMD::Vector<double,_7U>,_std::allocator<OpenMD::Vector<double,_7U>_>_>::~vector
            ((vector<OpenMD::Vector<double,_7U>,_std::allocator<OpenMD::Vector<double,_7U>_>_> *)
             this_00);
  std::vector<OpenMD::Vector<double,_7U>,_std::allocator<OpenMD::Vector<double,_7U>_>_>::~vector
            ((vector<OpenMD::Vector<double,_7U>,_std::allocator<OpenMD::Vector<double,_7U>_>_> *)
             this_00);
  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::~vector(this_00);
  return;
}

Assistant:

void ForceMatrixDecomposition::collectData() {
#ifdef IS_MPI
    snap_              = sman_->getCurrentSnapshot();
    atomStorageLayout_ = sman_->getAtomStorageLayout();

    int n = snap_->atomData.force.size();
    vector<Vector3d> frc_tmp(n, V3Zero);

    AtomPlanVectorRow->scatter(atomRowData.force, frc_tmp);
    for (int i = 0; i < n; i++) {
      snap_->atomData.force[i] += frc_tmp[i];
      frc_tmp[i] = 0.0;
    }

    AtomPlanVectorColumn->scatter(atomColData.force, frc_tmp);
    for (int i = 0; i < n; i++) {
      snap_->atomData.force[i] += frc_tmp[i];
    }

    if (atomStorageLayout_ & DataStorage::dslTorque) {
      int nt = snap_->atomData.torque.size();
      vector<Vector3d> trq_tmp(nt, V3Zero);

      AtomPlanVectorRow->scatter(atomRowData.torque, trq_tmp);
      for (int i = 0; i < nt; i++) {
        snap_->atomData.torque[i] += trq_tmp[i];
        trq_tmp[i] = 0.0;
      }

      AtomPlanVectorColumn->scatter(atomColData.torque, trq_tmp);
      for (int i = 0; i < nt; i++)
        snap_->atomData.torque[i] += trq_tmp[i];
    }

    if (atomStorageLayout_ & DataStorage::dslSkippedCharge) {
      int ns = snap_->atomData.skippedCharge.size();
      vector<RealType> skch_tmp(ns, 0.0);

      AtomPlanRealRow->scatter(atomRowData.skippedCharge, skch_tmp);
      for (int i = 0; i < ns; i++) {
        snap_->atomData.skippedCharge[i] += skch_tmp[i];
        skch_tmp[i] = 0.0;
      }

      AtomPlanRealColumn->scatter(atomColData.skippedCharge, skch_tmp);
      for (int i = 0; i < ns; i++)
        snap_->atomData.skippedCharge[i] += skch_tmp[i];
    }

    if (atomStorageLayout_ & DataStorage::dslFlucQForce) {
      int nq = snap_->atomData.flucQFrc.size();
      vector<RealType> fqfrc_tmp(nq, 0.0);

      AtomPlanRealRow->scatter(atomRowData.flucQFrc, fqfrc_tmp);
      for (int i = 0; i < nq; i++) {
        snap_->atomData.flucQFrc[i] += fqfrc_tmp[i];
        fqfrc_tmp[i] = 0.0;
      }

      AtomPlanRealColumn->scatter(atomColData.flucQFrc, fqfrc_tmp);
      for (int i = 0; i < nq; i++)
        snap_->atomData.flucQFrc[i] += fqfrc_tmp[i];
    }

    if (atomStorageLayout_ & DataStorage::dslElectricField) {
      int nef = snap_->atomData.electricField.size();
      vector<Vector3d> efield_tmp(nef, V3Zero);

      AtomPlanVectorRow->scatter(atomRowData.electricField, efield_tmp);
      for (int i = 0; i < nef; i++) {
        snap_->atomData.electricField[i] += efield_tmp[i];
        efield_tmp[i] = 0.0;
      }

      AtomPlanVectorColumn->scatter(atomColData.electricField, efield_tmp);
      for (int i = 0; i < nef; i++)
        snap_->atomData.electricField[i] += efield_tmp[i];
    }

    if (atomStorageLayout_ & DataStorage::dslSitePotential) {
      int nsp = snap_->atomData.sitePotential.size();
      vector<RealType> sp_tmp(nsp, 0.0);

      AtomPlanRealRow->scatter(atomRowData.sitePotential, sp_tmp);
      for (int i = 0; i < nsp; i++) {
        snap_->atomData.sitePotential[i] += sp_tmp[i];
        sp_tmp[i] = 0.0;
      }

      AtomPlanRealColumn->scatter(atomColData.sitePotential, sp_tmp);
      for (int i = 0; i < nsp; i++)
        snap_->atomData.sitePotential[i] += sp_tmp[i];
    }

    nLocal_ = snap_->getNumberOfAtoms();

    vector<potVec> pot_temp(nLocal_,
                            Vector<RealType, N_INTERACTION_FAMILIES>(0.0));
    vector<potVec> expot_temp(nLocal_,
                              Vector<RealType, N_INTERACTION_FAMILIES>(0.0));
    vector<potVec> selepot_temp(nLocal_,
                                Vector<RealType, N_INTERACTION_FAMILIES>(0.0));

    // scatter/gather pot_row into the members of my column

    AtomPlanPotRow->scatter(pot_row, pot_temp);
    AtomPlanPotRow->scatter(expot_row, expot_temp);
    AtomPlanPotRow->scatter(selepot_row, selepot_temp);

    for (std::size_t ii = 0; ii < pot_temp.size(); ii++)
      pairwisePot += pot_temp[ii];

    for (std::size_t ii = 0; ii < expot_temp.size(); ii++)
      excludedPot += expot_temp[ii];

    for (std::size_t ii = 0; ii < selepot_temp.size(); ii++)
      selectedPot += selepot_temp[ii];

    if (atomStorageLayout_ & DataStorage::dslParticlePot) {
      // This is the pairwise contribution to the particle pot.  The
      // embedding contribution is added in each of the low level
      // non-bonded routines.  In single processor, this is done in
      // unpackInteractionData, not in collectData.
      for (int ii = 0; ii < N_INTERACTION_FAMILIES; ii++) {
        for (int i = 0; i < nLocal_; i++) {
          // factor of two is because the total potential terms are divided
          // by 2 in parallel due to row/ column scatter
          snap_->atomData.particlePot[i] += 2.0 * pot_temp[i](ii);
        }
      }
    }

    fill(pot_temp.begin(), pot_temp.end(),
         Vector<RealType, N_INTERACTION_FAMILIES>(0.0));
    fill(expot_temp.begin(), expot_temp.end(),
         Vector<RealType, N_INTERACTION_FAMILIES>(0.0));
    fill(selepot_temp.begin(), selepot_temp.end(),
         Vector<RealType, N_INTERACTION_FAMILIES>(0.0));

    AtomPlanPotColumn->scatter(pot_col, pot_temp);
    AtomPlanPotColumn->scatter(expot_col, expot_temp);
    AtomPlanPotColumn->scatter(selepot_col, selepot_temp);

    for (std::size_t ii = 0; ii < pot_temp.size(); ii++)
      pairwisePot += pot_temp[ii];

    for (std::size_t ii = 0; ii < expot_temp.size(); ii++)
      excludedPot += expot_temp[ii];

    for (std::size_t ii = 0; ii < selepot_temp.size(); ii++)
      selectedPot += selepot_temp[ii];

    if (atomStorageLayout_ & DataStorage::dslParticlePot) {
      // This is the pairwise contribution to the particle pot.  The
      // embedding contribution is added in each of the low level
      // non-bonded routines.  In single processor, this is done in
      // unpackInteractionData, not in collectData.
      for (int ii = 0; ii < N_INTERACTION_FAMILIES; ii++) {
        for (int i = 0; i < nLocal_; i++) {
          // factor of two is because the total potential terms are divided
          // by 2 in parallel due to row/ column scatter
          snap_->atomData.particlePot[i] += 2.0 * pot_temp[i](ii);
        }
      }
    }

    if (atomStorageLayout_ & DataStorage::dslParticlePot) {
      int npp = snap_->atomData.particlePot.size();
      vector<RealType> ppot_temp(npp, 0.0);

      // This is the direct or embedding contribution to the particle
      // pot.

      AtomPlanRealRow->scatter(atomRowData.particlePot, ppot_temp);
      for (int i = 0; i < npp; i++) {
        snap_->atomData.particlePot[i] += ppot_temp[i];
      }

      fill(ppot_temp.begin(), ppot_temp.end(), 0.0);

      AtomPlanRealColumn->scatter(atomColData.particlePot, ppot_temp);
      for (int i = 0; i < npp; i++) {
        snap_->atomData.particlePot[i] += ppot_temp[i];
      }
    }

    MPI_Allreduce(MPI_IN_PLACE, &pairwisePot[0], N_INTERACTION_FAMILIES,
                  MPI_REALTYPE, MPI_SUM, MPI_COMM_WORLD);

    MPI_Allreduce(MPI_IN_PLACE, &excludedPot[0], N_INTERACTION_FAMILIES,
                  MPI_REALTYPE, MPI_SUM, MPI_COMM_WORLD);

    MPI_Allreduce(MPI_IN_PLACE, &selectedPot[0], N_INTERACTION_FAMILIES,
                  MPI_REALTYPE, MPI_SUM, MPI_COMM_WORLD);

    // Here be dragons.
    MPI_Comm col = colComm.getComm();

    MPI_Allreduce(MPI_IN_PLACE, &snap_->frameData.conductiveHeatFlux[0], 3,
                  MPI_REALTYPE, MPI_SUM, col);
#endif
  }